

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int is_stateless_reset(quicly_conn_t *conn,quicly_decoded_packet_t *decoded)

{
  uint8_t *puVar1;
  ulong uVar2;
  anon_enum_32 aVar3;
  undefined1 auVar4 [16];
  
  aVar3 = decoded->_is_stateless_reset_cached;
  if (aVar3 != QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET) {
    if (aVar3 == QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET) {
      return 0;
    }
    aVar3 = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    if (((conn->super).remote.cid_set.cids[0].is_active != 0) &&
       (uVar2 = (decoded->octets).len, 0x26 < uVar2)) {
      puVar1 = (decoded->octets).base + (uVar2 - 0x10);
      auVar4[0] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[0] == *puVar1);
      auVar4[1] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[1] == puVar1[1]);
      auVar4[2] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[2] == puVar1[2]);
      auVar4[3] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[3] == puVar1[3]);
      auVar4[4] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[4] == puVar1[4]);
      auVar4[5] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[5] == puVar1[5]);
      auVar4[6] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[6] == puVar1[6]);
      auVar4[7] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[7] == puVar1[7]);
      auVar4[8] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[8] == puVar1[8]);
      auVar4[9] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[9] == puVar1[9]);
      auVar4[10] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[10] == puVar1[10]);
      auVar4[0xb] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[0xb] == puVar1[0xb]
                     );
      auVar4[0xc] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[0xc] == puVar1[0xc]
                     );
      auVar4[0xd] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[0xd] == puVar1[0xd]
                     );
      auVar4[0xe] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[0xe] == puVar1[0xe]
                     );
      auVar4[0xf] = -((conn->super).remote.cid_set.cids[0].stateless_reset_token[0xf] == puVar1[0xf]
                     );
      return (int)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
    }
  }
  return aVar3;
}

Assistant:

static int is_stateless_reset(quicly_conn_t *conn, quicly_decoded_packet_t *decoded)
{
    switch (decoded->_is_stateless_reset_cached) {
    case QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET:
        return 1;
    case QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET:
        return 0;
    default:
        break;
    }

    if (!conn->super.remote.cid_set.cids[0].is_active)
        return 0;
    if (decoded->octets.len < QUICLY_STATELESS_RESET_PACKET_MIN_LEN)
        return 0;
    if (memcmp(decoded->octets.base + decoded->octets.len - QUICLY_STATELESS_RESET_TOKEN_LEN,
               conn->super.remote.cid_set.cids[0].stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN) != 0)
        return 0;

    return 1;
}